

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slist.cpp
# Opt level: O0

bool __thiscall curl::Slist::append(Slist *this,string *str)

{
  bool bVar1;
  char *str_00;
  string *str_local;
  Slist *this_local;
  
  str_00 = (char *)std::__cxx11::string::c_str();
  bVar1 = append(this,str_00);
  return bVar1;
}

Assistant:

bool Slist::append(const std::string& str) {
    return append(str.c_str());
}